

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Mapping.cpp
# Opt level: O3

int __thiscall axl::io::Mapping::open(Mapping *this,char *__file,int __oflag,...)

{
  SharedMemory *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  void *pvVar5;
  uint in_ECX;
  uint __oflag_00;
  EVP_PKEY_CTX *src;
  void *pvVar6;
  
  close(this,(int)__file);
  uVar1 = (in_ECX & 1) * 2 ^ 2;
  __oflag_00 = uVar1 + 0x40;
  if ((in_ECX & 4) != 0) {
    __oflag_00 = uVar1;
  }
  this_00 = &this->m_sharedMemory;
  iVar2 = psx::SharedMemory::open(this_00,__file,__oflag_00,0x1b6);
  if ((char)iVar2 != '\0') {
    iVar2 = (uint)((in_ECX & 1) == 0) * 2 + 1;
    if ((in_ECX & 4) != 0) {
      pvVar6 = (void *)0x0;
      pvVar5 = psx::Mapping::map(&this->m_mapping,(void *)0x0,___oflag,iVar2,1,
                                 (this->m_sharedMemory).super_File.
                                 super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                 .m_h,0);
      if (pvVar5 == (void *)0x0) goto LAB_00152a12;
LAB_001529f6:
      this->m_p = pvVar5;
      this->m_size = ___oflag;
      pvVar6 = pvVar5;
      goto LAB_00152a12;
    }
    uVar4 = psx::File::getSize(&this_00->super_File);
    if (uVar4 < ___oflag) {
      iVar3 = ftruncate64((this_00->super_File).
                          super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                          ___oflag);
      if (iVar3 != -1) goto LAB_0015298c;
      err::setLastSystemError();
    }
    else {
LAB_0015298c:
      pvVar5 = psx::Mapping::map(&this->m_mapping,(void *)0x0,___oflag,iVar2,1,
                                 (this->m_sharedMemory).super_File.
                                 super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>
                                 .m_h,0);
      if (pvVar5 != (void *)0x0) {
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
                  (&this->m_sharedMemoryName,(EVP_PKEY_CTX *)__file,src);
        goto LAB_001529f6;
      }
    }
    psx::SharedMemory::unlink(__file);
  }
  pvVar6 = (void *)0x0;
LAB_00152a12:
  return (int)pvVar6;
}

Assistant:

void*
Mapping::open(
	const sl::StringRef& name,
	size_t size,
	uint_t flags
) {
	ASSERT(size != -1);

	close();

	void* p;

#if (_AXL_OS_WIN)
	uint_t protection = (flags & FileFlag_ReadOnly) ? PAGE_READONLY : PAGE_READWRITE;
	uint_t access = (flags & FileFlag_ReadOnly) ? FILE_MAP_READ : FILE_MAP_READ | FILE_MAP_WRITE;

	sl::String_w name_w = name;

	bool result = (flags & FileFlag_OpenExisting) ?
		m_mapping.open(access, false, name_w):
		m_mapping.create(INVALID_HANDLE_VALUE, NULL, protection, size, name_w);

	if (!result)
		return NULL;

	p = m_view.view(m_mapping, access, 0, size);
	if (!p) {
		m_mapping.close();
		return NULL;
	}
#elif (_AXL_OS_POSIX)
	int shmFlags = (flags & FileFlag_ReadOnly) ? O_RDONLY : O_RDWR;
	int protection = (flags & FileFlag_ReadOnly) ? PROT_READ : PROT_READ | PROT_WRITE;

	if (!(flags & FileFlag_OpenExisting))
		shmFlags |= O_CREAT;

	bool result = m_sharedMemory.open(name, shmFlags, S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH);
	if (!result)
		return NULL;

	if (!(flags & FileFlag_OpenExisting) && m_sharedMemory.getSize() < size) {
		result = m_sharedMemory.setSize(size);
		if (!result) {
			if (!(flags & FileFlag_OpenExisting))
				psx::SharedMemory::unlink(name);

			return NULL;
		}
	}

	p = m_mapping.map(NULL, size, protection, MAP_SHARED, m_sharedMemory, 0);
	if (!p) {
		if (!(flags & FileFlag_OpenExisting))
			psx::SharedMemory::unlink(name);

		return NULL;
	}

	if (!(flags & FileFlag_OpenExisting))
		m_sharedMemoryName = name;

#endif

	m_p = p;
	m_size = size;
	return m_p;
}